

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O1

void __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
::scale(BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
        *this,double *scalar,
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *ignored_variables,
       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *ignored_interactions,bool ignored_offset)

{
  double dVar1;
  ulong uVar2;
  pointer pbVar3;
  pointer pcVar4;
  pointer ppVar5;
  double dVar6;
  long lVar7;
  iterator iVar8;
  double *pdVar9;
  runtime_error *this_00;
  long lVar10;
  ActualDstType actualDst;
  pointer ppVar11;
  ulong uVar12;
  long lVar13;
  pointer pbVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  key_type local_50;
  
  dVar1 = *scalar;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"scalar must not be zero");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar12 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_rows;
  uVar2 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
          m_storage.m_cols;
  if ((long)(uVar2 | uVar12) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  pdVar9 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_data;
  lVar7 = uVar2 * uVar12;
  uVar12 = lVar7 - (lVar7 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar7) {
    lVar13 = 0;
    do {
      dVar6 = (pdVar9 + lVar13)[1];
      pdVar9[lVar13] = pdVar9[lVar13] * dVar1;
      (pdVar9 + lVar13)[1] = dVar6 * dVar1;
      lVar13 = lVar13 + 2;
    } while (lVar13 < (long)uVar12);
  }
  if ((long)uVar12 < lVar7) {
    do {
      pdVar9[uVar12] = pdVar9[uVar12] * dVar1;
      uVar12 = uVar12 + 1;
    } while (lVar7 - uVar12 != 0);
  }
  pbVar14 = (ignored_variables->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (ignored_variables->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_78 = ignored_interactions;
  if (pbVar14 != pbVar3) {
    do {
      dVar1 = *scalar;
      pcVar4 = (pbVar14->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar4,pcVar4 + pbVar14->_M_string_length);
      iVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->_label_to_idx)._M_h,&local_50);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      lVar7 = *(long *)((long)iVar8.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                              ._M_cur + 0x28);
      if ((((lVar7 < 0) ||
           (lVar13 = (this->_quadmat).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                     m_rows, lVar13 < 1)) || (lVar13 <= lVar7)) ||
         (lVar10 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                   .m_storage.m_cols, lVar10 < lVar13)) {
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                     );
      }
      lVar10 = lVar10 * lVar7;
      pdVar9 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data;
      pdVar9[lVar10 + lVar13 + -1] = (1.0 / dVar1) * pdVar9[lVar10 + lVar13 + -1];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 != pbVar3);
  }
  ppVar11 = (local_78->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (local_78->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar11 != ppVar5) {
    do {
      dVar1 = *scalar;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pcVar4 = (ppVar11->first)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar4,pcVar4 + (ppVar11->first)._M_string_length);
      pcVar4 = (ppVar11->second)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar4,pcVar4 + (ppVar11->second)._M_string_length);
      pdVar9 = _mat(this,&local_98,&local_70);
      *pdVar9 = (1.0 / dVar1) * *pdVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      ppVar11 = ppVar11 + 1;
    } while (ppVar11 != ppVar5);
  }
  if (!ignored_offset) {
    this->m_offset = *scalar * this->m_offset;
  }
  return;
}

Assistant:

void scale(
        const FloatType &scalar,
        const std::vector<IndexType> &ignored_variables = {},
        const std::vector<std::pair<IndexType, IndexType>> &ignored_interactions = {},
        const bool ignored_offset = false ) {
      if ( scalar == 0.0 )
        throw std::runtime_error( "scalar must not be zero" );

      // scale
      _quadmat *= scalar;

      // revert scale of linear
      for ( const auto &it : ignored_variables ) {
        _mat( it ) *= 1.0 / scalar;
      }

      // revert scale of quadratic
      for ( const auto &it : ignored_interactions ) {
        _mat( it.first, it.second ) *= 1.0 / scalar;
      }

      // scaling offset
      if ( !ignored_offset ) {
        m_offset *= scalar;
      }
    }